

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_imexgus.c
# Opt level: O2

SUNErrCode SUNAdaptController_Space_ImExGus(SUNAdaptController C,long *lenrw,long *leniw)

{
  *lenrw = 7;
  *leniw = 1;
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_Space_ImExGus(SUNAdaptController C,
                                            long int* lenrw, long int* leniw)
{
  SUNFunctionBegin(C->sunctx);
  SUNAssert(lenrw, SUN_ERR_ARG_CORRUPT);
  SUNAssert(leniw, SUN_ERR_ARG_CORRUPT);
  *lenrw = 7;
  *leniw = 1;
  return SUN_SUCCESS;
}